

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prwlock_test.cpp
# Opt level: O0

void * writer_thread_func(void *data)

{
  int iVar1;
  int local_18;
  pint counter;
  pint string_num;
  void *data_local;
  
  local_18 = 0;
  while (is_threads_working == 1) {
    p_uthread_sleep(10);
    iVar1 = p_rwlock_writer_trylock(test_rwlock);
    if ((iVar1 == 0) && (iVar1 = p_rwlock_writer_lock(test_rwlock), iVar1 == 0)) {
      p_uthread_exit(0xffffffff);
    }
    memset(string_buf,0,0x32);
    if ((int)data == 1) {
      strcpy(string_buf,"This is a test string.");
    }
    else {
      strcpy(string_buf,"Ouh, yet another string to check!");
    }
    iVar1 = p_rwlock_writer_unlock(test_rwlock);
    if (iVar1 == 0) {
      p_uthread_exit(0xffffffff);
    }
    local_18 = local_18 + 1;
    p_atomic_int_inc(&writers_counter);
  }
  p_uthread_exit(local_18);
  return (void *)0x0;
}

Assistant:

static void * writer_thread_func (void *data)
{
	pint string_num = PPOINTER_TO_INT (data);
	pint counter    = 0;

	while (is_threads_working == TRUE) {
		p_uthread_sleep (10);

		if (p_rwlock_writer_trylock (test_rwlock) == FALSE) {
			if (p_rwlock_writer_lock (test_rwlock) == FALSE)
				p_uthread_exit (-1);
		}

		memset (string_buf, 0, sizeof (string_buf));

		if (string_num == 1)
			strcpy (string_buf, PRWLOCK_TEST_STRING_1);
		else
			strcpy (string_buf, PRWLOCK_TEST_STRING_2);

		if (p_rwlock_writer_unlock (test_rwlock) == FALSE)
			p_uthread_exit (-1);

		++counter;

		p_atomic_int_inc (&writers_counter);
	}

	p_uthread_exit (counter);

	return NULL;
}